

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interrupt.cpp
# Opt level: O3

void __thiscall duckdb::InterruptDoneSignalState::Await(InterruptDoneSignalState *this)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->lock;
  ::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if (this->done == false) {
    do {
      ::std::condition_variable::wait((unique_lock *)&this->cv);
    } while (this->done != true);
  }
  this->done = false;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void InterruptDoneSignalState::Await() {
	std::unique_lock<std::mutex> lck(lock);
	cv.wait(lck, [&]() { return done; });

	// Reset after signal received
	done = false;
}